

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

void __thiscall iqxmlrpc::http::Header::set_content_length(Header *this,size_t len)

{
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  size_t local_18;
  size_t len_local;
  Header *this_local;
  
  local_18 = len;
  len_local = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"content-length",&local_39)
  ;
  set_option(this,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (local_18 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"content-type",&local_71)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"text/xml",&local_99);
    set_option(this,&local_70,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return;
}

Assistant:

void Header::set_content_length(size_t len)
{
  set_option(names::content_length, len);

  if (len)
    set_option(names::content_type, "text/xml");
}